

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_app.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Exception *this;
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  exception *ex;
  Virtual_Machine VM;
  Parser main_parser;
  Scanner main_scanner;
  int i;
  char **argv_local;
  int argc_local;
  
  if (1 < argc) {
    Scanner::Scanner((Scanner *)
                     &main_parser.prog.super_vector<Lex,_std::allocator<Lex>_>.
                      super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,argv[1]);
    Lex::construct_lex_map();
    Scanner::start((Scanner *)
                   &main_parser.prog.super_vector<Lex,_std::allocator<Lex>_>.
                    super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
    if (DEBUG_MODE != 0) {
      Scanner::print_vec((Scanner *)
                         &main_parser.prog.super_vector<Lex,_std::allocator<Lex>_>.
                          super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      poVar1 = std::operator<<((ostream *)&std::cout,"--------TABLES--------");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      for (main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          uVar2 = (ulong)(int)main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
          sVar3 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::size
                            (&Scanner::ID_tables_vec), uVar2 < sVar3;
          main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[]
                           (&Scanner::ID_tables_vec,
                            (long)(int)main_scanner.lex_vec.
                                       super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
        ID_table_t::print_table(pvVar4);
      }
    }
    if (DEBUG_MODE != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ PARSER $$$$$$$$$$$");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    Parser::Parser((Parser *)&VM.tmp1,(vector<Lex,_std::allocator<Lex>_> *)&main_scanner.field_0x30,
                   &Scanner::ID_tables_vec);
    Parser::start((Parser *)&VM.tmp1);
    if (DEBUG_MODE != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"--------TABLES--------");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      for (main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          uVar2 = (ulong)(int)main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
          sVar3 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::size
                            (&Scanner::ID_tables_vec), uVar2 < sVar3;
          main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)main_scanner.lex_vec.super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[]
                           (&Scanner::ID_tables_vec,
                            (long)(int)main_scanner.lex_vec.
                                       super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
        ID_table_t::print_table(pvVar4);
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ PROG $$$$$$$$$$$");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      RPN::print((RPN *)&main_parser.ID_tables_vec);
    }
    if (DEBUG_MODE != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    Virtual_Machine::Virtual_Machine
              ((Virtual_Machine *)&ex,(RPN *)&main_parser.ID_tables_vec,
               (vector<ID_table_t,_std::allocator<ID_table_t>_> *)main_parser._208_8_);
    Virtual_Machine::start((Virtual_Machine *)&ex);
    Virtual_Machine::~Virtual_Machine((Virtual_Machine *)&ex);
    Parser::~Parser((Parser *)&VM.tmp1);
    Scanner::~Scanner((Scanner *)
                      &main_parser.prog.super_vector<Lex,_std::allocator<Lex>_>.
                       super__Vector_base<Lex,_std::allocator<Lex>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage);
    return 0;
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this,"Interpreter error: no file",'\0');
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int main(int argc, char* argv[]){
    try {
        if(argc < 2) throw Exception("Interpreter error: no file");

        int i;

        Scanner main_scanner(argv[1]);
        Lex::construct_lex_map();

        main_scanner.start();
        if (DEBUG_MODE){
            main_scanner.print_vec();
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
        }
        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ PARSER $$$$$$$$$$$" << endl;

        Parser main_parser(main_scanner.lex_vec, main_scanner.ID_tables_vec);
        main_parser.start();

        if (DEBUG_MODE) {
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
            cout << "$$$$$$$$$$ PROG $$$$$$$$$$$" << endl;
            main_parser.prog.print();
        }

        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$" << endl;

        Virtual_Machine VM(main_parser.prog, main_parser.ID_tables_vec);
        VM.start();
    }
    catch (exception& ex){
        cout << ex.what() << endl;
        return -1;
    }
    return 0;
}